

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.cpp
# Opt level: O3

int64_t Allocations::getSubAreaUsage(int64_t fileID,int64_t position)

{
  _Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_> it;
  _Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_> _Var1;
  mapped_type *pmVar2;
  long lVar3;
  long lVar4;
  int64_t iVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>,_std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>_>
  pVar6;
  Key key;
  key_type local_20;
  
  local_20.fileID = fileID;
  local_20.position = position;
  pVar6 = std::
          _Rb_tree<Allocations::Key,_std::pair<const_Allocations::Key,_Allocations::SubArea>,_std::_Select1st<std::pair<const_Allocations::Key,_Allocations::SubArea>_>,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>_>
          ::equal_range(&subAreas._M_t,&local_20);
  _Var1 = pVar6.first._M_node;
  if (_Var1._M_node == pVar6.second._M_node._M_node) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    do {
      lVar4 = (long)&(_Var1._M_node[1]._M_left)->_M_color +
              (long)&(_Var1._M_node[1]._M_right)->_M_color;
      if (lVar4 <= lVar3) {
        lVar4 = lVar3;
      }
      lVar3 = lVar4;
      _Var1._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var1._M_node);
    } while (_Var1._M_node != pVar6.second._M_node._M_node);
  }
  pmVar2 = std::
           map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
           ::operator[](&allocations,&local_20);
  if (pmVar2->usage < lVar3) {
    pmVar2 = std::
             map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
             ::operator[](&allocations,&local_20);
    iVar5 = lVar3 - pmVar2->usage;
  }
  else {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int64_t Allocations::getSubAreaUsage(int64_t fileID, int64_t position)
{
	Key key{ fileID, position };
	// For safety, just find the end of the last sub area.
	int64_t maxExtent = 0;
	auto range = subAreas.equal_range(key);
	for (auto it = range.first; it != range.second; ++it)
	{
		int64_t extent = it->second.offset + it->second.size;
		maxExtent = std::max(extent, maxExtent);
	}

	// Now subtract out the original usage.
	if (maxExtent <= allocations[key].usage)
		return 0;
	return maxExtent - allocations[key].usage;
}